

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanKampenUtils.cpp
# Opt level: O2

size_t __thiscall van_kampen::ProcessLogger::iterate(ProcessLogger *this)

{
  ulong uVar1;
  size_t sVar2;
  int args_1;
  char *args;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  uVar1 = this->total_;
  sVar2 = uVar1;
  if (this->currentIt_ < uVar1) {
    sVar2 = this->currentIt_ + 1;
    auVar3._8_4_ = (int)(sVar2 >> 0x20);
    auVar3._0_8_ = sVar2;
    auVar3._12_4_ = 0x45300000;
    auVar4._8_4_ = (int)(uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = 0x45300000;
    args_1 = (int)((((auVar3._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) /
                   ((auVar4._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0))) * 100.0);
    this->currentIt_ = sVar2;
    if (this->lastResult != args_1) {
      this->lastResult = args_1;
      args = "";
      if (args_1 < 10) {
        args = " ";
      }
      log<char_const*,int,char_const*>(this,args,args_1,"%    ");
      sVar2 = this->currentIt_;
    }
  }
  return sVar2;
}

Assistant:

std::size_t ProcessLogger::iterate()
{
    if (currentIt_ >= total_)
    {
        return total_;
    }
    ++currentIt_;
    int percent = (static_cast<double>(currentIt_) / static_cast<double>(total_)) * 100.0;
    if (percent != lastResult)
    {
        lastResult = percent;
        log((percent < 10 ? " " : ""), percent, "%    ");
    }
    return currentIt_;
}